

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O3

ma_bool32 ma_dr_flac__seek_to_pcm_frame__brute_force(ma_dr_flac *pFlac,ma_uint64 pcmFrameIndex)

{
  bool bVar1;
  ma_bool32 mVar2;
  ma_result mVar3;
  ma_uint64 mVar4;
  long lVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  
  uVar7 = pFlac->currentPCMFrame;
  if (pcmFrameIndex < uVar7) {
    mVar2 = ma_dr_flac__seek_to_byte(&pFlac->bs,pFlac->firstFLACFramePosInBytes);
    uVar7 = 0;
    memset(&pFlac->currentFLACFrame,0,0xa8);
    if (mVar2 == 0) goto LAB_0015773c;
    mVar2 = ma_dr_flac__read_next_flac_frame_header
                      (&pFlac->bs,pFlac->bitsPerSample,&(pFlac->currentFLACFrame).header);
LAB_00157645:
    uVar7 = 0;
    if (mVar2 == 0) goto LAB_0015773c;
    bVar1 = true;
  }
  else {
    if ((uVar7 == 0) && (uVar7 = 0, (pFlac->currentFLACFrame).pcmFramesRemaining == 0)) {
      mVar2 = ma_dr_flac__read_next_flac_frame_header
                        (&pFlac->bs,pFlac->bitsPerSample,&(pFlac->currentFLACFrame).header);
      goto LAB_00157645;
    }
    bVar1 = false;
  }
  do {
    mVar4 = (pFlac->currentFLACFrame).header.pcmFrameNumber;
    if (mVar4 == 0) {
      mVar4 = (ulong)pFlac->maxBlockSizeInPCMFrames *
              (ulong)(pFlac->currentFLACFrame).header.flacFrameNumber;
    }
    lVar5 = (pFlac->currentFLACFrame).header.blockSizeInPCMFrames + mVar4;
    lVar6 = lVar5 + -1;
    if (lVar5 == 0) {
      lVar6 = 0;
    }
    uVar8 = (uVar7 - mVar4) + lVar6 + 1;
    if (pcmFrameIndex < uVar8) {
      if (bVar1) {
        mVar3 = ma_dr_flac__decode_flac_frame(pFlac);
        if (mVar3 == MA_CRC_MISMATCH) goto LAB_00157701;
        if (mVar3 != MA_SUCCESS) break;
      }
      mVar4 = ma_dr_flac__seek_forward_by_pcm_frames(pFlac,pcmFrameIndex - uVar7);
      uVar7 = (ulong)(mVar4 == pcmFrameIndex - uVar7);
      goto LAB_0015773c;
    }
    if (bVar1) {
      mVar3 = ma_dr_flac__seek_flac_frame(pFlac);
      if (mVar3 != MA_CRC_MISMATCH) {
        uVar7 = uVar8;
        if (mVar3 == MA_SUCCESS) goto LAB_001576eb;
        break;
      }
    }
    else {
      uVar7 = uVar7 + (pFlac->currentFLACFrame).pcmFramesRemaining;
      (pFlac->currentFLACFrame).pcmFramesRemaining = 0;
LAB_001576eb:
      if ((pFlac->totalPCMFrameCount == pcmFrameIndex) && (uVar7 == pFlac->totalPCMFrameCount)) {
        uVar7 = 1;
        goto LAB_0015773c;
      }
    }
LAB_00157701:
    mVar2 = ma_dr_flac__read_next_flac_frame_header
                      (&pFlac->bs,pFlac->bitsPerSample,&(pFlac->currentFLACFrame).header);
    bVar1 = true;
  } while (mVar2 != 0);
  uVar7 = 0;
LAB_0015773c:
  return (ma_bool32)uVar7;
}

Assistant:

static ma_bool32 ma_dr_flac__seek_to_pcm_frame__brute_force(ma_dr_flac* pFlac, ma_uint64 pcmFrameIndex)
{
    ma_bool32 isMidFrame = MA_FALSE;
    ma_uint64 runningPCMFrameCount;
    MA_DR_FLAC_ASSERT(pFlac != NULL);
    if (pcmFrameIndex >= pFlac->currentPCMFrame) {
        runningPCMFrameCount = pFlac->currentPCMFrame;
        if (pFlac->currentPCMFrame == 0 && pFlac->currentFLACFrame.pcmFramesRemaining == 0) {
            if (!ma_dr_flac__read_next_flac_frame_header(&pFlac->bs, pFlac->bitsPerSample, &pFlac->currentFLACFrame.header)) {
                return MA_FALSE;
            }
        } else {
            isMidFrame = MA_TRUE;
        }
    } else {
        runningPCMFrameCount = 0;
        if (!ma_dr_flac__seek_to_first_frame(pFlac)) {
            return MA_FALSE;
        }
        if (!ma_dr_flac__read_next_flac_frame_header(&pFlac->bs, pFlac->bitsPerSample, &pFlac->currentFLACFrame.header)) {
            return MA_FALSE;
        }
    }
    for (;;) {
        ma_uint64 pcmFrameCountInThisFLACFrame;
        ma_uint64 firstPCMFrameInFLACFrame = 0;
        ma_uint64 lastPCMFrameInFLACFrame = 0;
        ma_dr_flac__get_pcm_frame_range_of_current_flac_frame(pFlac, &firstPCMFrameInFLACFrame, &lastPCMFrameInFLACFrame);
        pcmFrameCountInThisFLACFrame = (lastPCMFrameInFLACFrame - firstPCMFrameInFLACFrame) + 1;
        if (pcmFrameIndex < (runningPCMFrameCount + pcmFrameCountInThisFLACFrame)) {
            ma_uint64 pcmFramesToDecode = pcmFrameIndex - runningPCMFrameCount;
            if (!isMidFrame) {
                ma_result result = ma_dr_flac__decode_flac_frame(pFlac);
                if (result == MA_SUCCESS) {
                    return ma_dr_flac__seek_forward_by_pcm_frames(pFlac, pcmFramesToDecode) == pcmFramesToDecode;
                } else {
                    if (result == MA_CRC_MISMATCH) {
                        goto next_iteration;
                    } else {
                        return MA_FALSE;
                    }
                }
            } else {
                return ma_dr_flac__seek_forward_by_pcm_frames(pFlac, pcmFramesToDecode) == pcmFramesToDecode;
            }
        } else {
            if (!isMidFrame) {
                ma_result result = ma_dr_flac__seek_to_next_flac_frame(pFlac);
                if (result == MA_SUCCESS) {
                    runningPCMFrameCount += pcmFrameCountInThisFLACFrame;
                } else {
                    if (result == MA_CRC_MISMATCH) {
                        goto next_iteration;
                    } else {
                        return MA_FALSE;
                    }
                }
            } else {
                runningPCMFrameCount += pFlac->currentFLACFrame.pcmFramesRemaining;
                pFlac->currentFLACFrame.pcmFramesRemaining = 0;
                isMidFrame = MA_FALSE;
            }
            if (pcmFrameIndex == pFlac->totalPCMFrameCount && runningPCMFrameCount == pFlac->totalPCMFrameCount) {
                return MA_TRUE;
            }
        }
    next_iteration:
        if (!ma_dr_flac__read_next_flac_frame_header(&pFlac->bs, pFlac->bitsPerSample, &pFlac->currentFLACFrame.header)) {
            return MA_FALSE;
        }
    }
}